

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token * __thiscall enact::Lexer::scanToken(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  TokenType type;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string errorMessage;
  char c;
  Lexer *this_local;
  
  skipWhitespace(this);
  this->m_start = this->m_current;
  bVar1 = isAtEnd(this);
  if (bVar1) {
    makeToken(__return_storage_ptr__,this,END_OF_FILE);
  }
  else {
    errorMessage.field_2._M_local_buf[0xf] = advance(this);
    bVar1 = isDigit(this,errorMessage.field_2._M_local_buf[0xf]);
    if (bVar1) {
      number(__return_storage_ptr__,this);
    }
    else {
      bVar1 = isIdentifierStart(this,errorMessage.field_2._M_local_buf[0xf]);
      if (bVar1) {
        identifier(__return_storage_ptr__,this);
      }
      else {
        switch(errorMessage.field_2._M_local_buf[0xf]) {
        case '!':
          bVar1 = match(this,'=');
          type = BANG;
          if (bVar1) {
            type = BANG_EQUAL;
          }
          makeToken(__return_storage_ptr__,this,type);
          break;
        case '\"':
          string(__return_storage_ptr__,this);
          break;
        case '#':
          makeToken(__return_storage_ptr__,this,HASH);
          break;
        case '$':
          makeToken(__return_storage_ptr__,this,DOLLAR);
          break;
        default:
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_40,"Unrecognized character \'",&local_41);
          std::allocator<char>::~allocator(&local_41);
          std::__cxx11::string::push_back((char)local_40);
          std::__cxx11::string::append(local_40);
          errorToken(__return_storage_ptr__,this,(string *)local_40);
          std::__cxx11::string::~string((string *)local_40);
          break;
        case '&':
          makeToken(__return_storage_ptr__,this,AMPERSAND);
          break;
        case '\'':
          makeToken(__return_storage_ptr__,this,APOSTROPHE);
          break;
        case '(':
          makeToken(__return_storage_ptr__,this,LEFT_PAREN);
          break;
        case ')':
          if (this->m_currentInterpolations < 1) {
            makeToken(__return_storage_ptr__,this,RIGHT_PAREN);
          }
          else {
            interpolationEnd(__return_storage_ptr__,this);
          }
          break;
        case '*':
          makeToken(__return_storage_ptr__,this,STAR);
          break;
        case '+':
          makeToken(__return_storage_ptr__,this,PLUS);
          break;
        case ',':
          makeToken(__return_storage_ptr__,this,COMMA);
          break;
        case '-':
          makeToken(__return_storage_ptr__,this,MINUS);
          break;
        case '.':
          bVar1 = match(this,'.');
          if (bVar1) {
            bVar1 = match(this,'.');
            if (bVar1) {
              makeToken(__return_storage_ptr__,this,DOT_DOT_DOT);
            }
            else {
              makeToken(__return_storage_ptr__,this,DOT_DOT);
            }
          }
          else {
            makeToken(__return_storage_ptr__,this,DOT);
          }
          break;
        case '/':
          makeToken(__return_storage_ptr__,this,SLASH);
          break;
        case ';':
          makeToken(__return_storage_ptr__,this,SEMICOLON);
          break;
        case '<':
          bVar1 = match(this,'=');
          if (bVar1) {
            makeToken(__return_storage_ptr__,this,LESS_EQUAL);
          }
          else {
            bVar1 = match(this,'<');
            if (bVar1) {
              makeToken(__return_storage_ptr__,this,LESS_LESS);
            }
            else {
              makeToken(__return_storage_ptr__,this,LESS);
            }
          }
          break;
        case '=':
          bVar1 = match(this,'=');
          if (bVar1) {
            makeToken(__return_storage_ptr__,this,EQUAL_EQUAL);
          }
          else {
            bVar1 = match(this,'>');
            if (bVar1) {
              makeToken(__return_storage_ptr__,this,EQUAL_GREATER);
            }
            else {
              makeToken(__return_storage_ptr__,this,EQUAL);
            }
          }
          break;
        case '>':
          bVar1 = match(this,'=');
          if (bVar1) {
            makeToken(__return_storage_ptr__,this,GREATER_EQUAL);
          }
          else {
            bVar1 = match(this,'>');
            if (bVar1) {
              makeToken(__return_storage_ptr__,this,GREATER_GREATER);
            }
            else {
              makeToken(__return_storage_ptr__,this,GREATER);
            }
          }
          break;
        case '?':
          makeToken(__return_storage_ptr__,this,QUESTION);
          break;
        case '[':
          makeToken(__return_storage_ptr__,this,LEFT_SQUARE);
          break;
        case ']':
          makeToken(__return_storage_ptr__,this,RIGHT_SQUARE);
          break;
        case '^':
          makeToken(__return_storage_ptr__,this,CARAT);
          break;
        case '{':
          makeToken(__return_storage_ptr__,this,LEFT_BRACE);
          break;
        case '|':
          makeToken(__return_storage_ptr__,this,PIPE);
          break;
        case '}':
          makeToken(__return_storage_ptr__,this,RIGHT_BRACE);
          break;
        case '~':
          makeToken(__return_storage_ptr__,this,TILDE);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::scanToken() {
        skipWhitespace();
        m_start = m_current;

        if (isAtEnd()) return makeToken(TokenType::END_OF_FILE);

        char c = advance();

        if (isDigit(c)) return number();
        if (isIdentifierStart(c)) return identifier();

        switch (c) {
            // Single character tokens.
            case '(':
                return makeToken(TokenType::LEFT_PAREN);
            case ')':
                if (m_currentInterpolations > 0) {
                    return interpolationEnd();
                }
                return makeToken(TokenType::RIGHT_PAREN);
            case '{':
                return makeToken(TokenType::LEFT_BRACE);
            case '}':
                return makeToken(TokenType::RIGHT_BRACE);
            case '[':
                return makeToken(TokenType::LEFT_SQUARE);
            case ']':
                return makeToken(TokenType::RIGHT_SQUARE);
            case '&':
                return makeToken(TokenType::AMPERSAND);
            case '\'':
                return makeToken(TokenType::APOSTROPHE);
            case '^':
                return makeToken(TokenType::CARAT);
            case ',':
                return makeToken(TokenType::COMMA);
            case '$':
                return makeToken(TokenType::DOLLAR);
            case '#':
                return makeToken(TokenType::HASH);
            case '-':
                return makeToken(TokenType::MINUS);
            case '|':
                return makeToken(TokenType::PIPE);
            case '+':
                return makeToken(TokenType::PLUS);
            case '?':
                return makeToken(TokenType::QUESTION);
            case ';':
                return makeToken(TokenType::SEMICOLON);
            case '/':
                return makeToken(TokenType::SLASH);
            case '*':
                return makeToken(TokenType::STAR);
            case '~':
                return makeToken(TokenType::TILDE);

            // 1 or 2 character tokens.
            case '!':
                return makeToken(match('=') ? TokenType::BANG_EQUAL : TokenType::BANG);
            case '=':
                if (match('=')) {
                    return makeToken(TokenType::EQUAL_EQUAL);
                }
                if (match('>')) {
                    return makeToken(TokenType::EQUAL_GREATER);
                }
                return makeToken(TokenType::EQUAL);
            case '>':
                if (match('=')) {
                    return makeToken(TokenType::GREATER_EQUAL);
                }
                if (match('>')) {
                    return makeToken(TokenType::GREATER_GREATER);
                }
                return makeToken(TokenType::GREATER);
            case '<':
                if (match('=')) {
                    return makeToken(TokenType::LESS_EQUAL);
                }
                if (match('<')) {
                    return makeToken(TokenType::LESS_LESS);
                }
                return makeToken(TokenType::LESS);

            // 1, 2 or 3 character tokens.
            case '.':
                if (match('.')) {
                    if (match('.')) {
                        return makeToken(TokenType::DOT_DOT_DOT);
                    }
                    return makeToken(TokenType::DOT_DOT);
                }
                return makeToken(TokenType::DOT);

            case '"':
                return string();
        }

        std::string errorMessage = "Unrecognized character '";
        errorMessage.push_back(c);
        errorMessage.append("'.");
        return errorToken(errorMessage);
    }